

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SampleShadingTests::init(SampleShadingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  SampleShadingStateCase *pSVar3;
  MinSampleShadingValueCase *pMVar4;
  TestNode *node;
  ulong extraout_RAX;
  SampleShadingRenderingCase *pSVar5;
  char *pcVar6;
  ulong uVar7;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint local_34;
  TestNode *pTStack_30;
  int ndx;
  TestCaseGroup *minSamplesGroup;
  TestNode *local_18;
  TestCaseGroup *stateQueryGroup;
  SampleShadingTests *this_local;
  
  stateQueryGroup = (TestCaseGroup *)this;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query tests.");
  local_18 = pTVar2;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_sample_shading","Min sample shading tests.");
  pTStack_30 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,local_18);
  tcu::TestNode::addChild((TestNode *)this,pTStack_30);
  pTVar2 = local_18;
  pSVar3 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"sample_shading_is_enabled",
             "test SAMPLE_SHADING",QUERY_ISENABLED);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = local_18;
  pSVar3 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"sample_shading_get_boolean",
             "test SAMPLE_SHADING",QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = local_18;
  pSVar3 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"sample_shading_get_integer",
             "test SAMPLE_SHADING",QUERY_INTEGER);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = local_18;
  pSVar3 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"sample_shading_get_float",
             "test SAMPLE_SHADING",QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = local_18;
  pSVar3 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"sample_shading_get_integer64",
             "test SAMPLE_SHADING",QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = local_18;
  pMVar4 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_boolean",
             "test MIN_SAMPLE_SHADING_VALUE",QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar4);
  pTVar2 = local_18;
  pMVar4 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_integer",
             "test MIN_SAMPLE_SHADING_VALUE",QUERY_INTEGER);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar4);
  pTVar2 = local_18;
  pMVar4 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_float",
             "test MIN_SAMPLE_SHADING_VALUE",QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar4);
  pTVar2 = local_18;
  pMVar4 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar4,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_integer64",
             "test MIN_SAMPLE_SHADING_VALUE",QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar4);
  pTVar2 = local_18;
  node = (TestNode *)operator_new(0x78);
  anon_unknown_2::MinSampleShadingValueClampingCase::MinSampleShadingValueClampingCase
            ((MinSampleShadingValueClampingCase *)node,(this->super_TestCaseGroup).m_context,
             "min_sample_shading_value_clamping","test MIN_SAMPLE_SHADING_VALUE clamping");
  tcu::TestNode::addChild(pTVar2,node);
  local_34 = 0;
  uVar7 = extraout_RAX;
  while (pTVar2 = pTStack_30, (int)local_34 < 9) {
    pSVar5 = (SampleShadingRenderingCase *)operator_new(0x130);
    local_7a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = init::targets[(int)local_34].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar6,&local_79);
    std::operator+(&local_58,&local_78,"_color");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleShadingRenderingCase::SampleShadingRenderingCase
              (pSVar5,pCVar1,pcVar6,"Test multiple samples per pixel with color",
               init::targets[(int)local_34].target,init::targets[(int)local_34].numSamples,
               TEST_COLOR);
    local_7a = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar5);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pTVar2 = pTStack_30;
    pSVar5 = (SampleShadingRenderingCase *)operator_new(0x130);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = init::targets[(int)local_34].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar6,&local_c1);
    std::operator+(&local_a0,&local_c0,"_discard");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleShadingRenderingCase::SampleShadingRenderingCase
              (pSVar5,pCVar1,pcVar6,"Test multiple samples per pixel with",
               init::targets[(int)local_34].target,init::targets[(int)local_34].numSamples,
               TEST_DISCARD);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    local_34 = local_34 + 1;
    uVar7 = (ulong)local_34;
  }
  return (int)uVar7;
}

Assistant:

void SampleShadingTests::init (void)
{
	tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query tests.");
	tcu::TestCaseGroup* const minSamplesGroup = new tcu::TestCaseGroup(m_testCtx, "min_sample_shading", "Min sample shading tests.");

	addChild(stateQueryGroup);
	addChild(minSamplesGroup);

	// .state query
	{
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_is_enabled",				"test SAMPLE_SHADING",						QUERY_ISENABLED));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_boolean",				"test SAMPLE_SHADING",						QUERY_BOOLEAN));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer",				"test SAMPLE_SHADING",						QUERY_INTEGER));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_float",					"test SAMPLE_SHADING",						QUERY_FLOAT));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer64",				"test SAMPLE_SHADING",						QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_boolean",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_BOOLEAN));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_float",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_FLOAT));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer64",	"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueClampingCase	(m_context, "min_sample_shading_value_clamping",		"test MIN_SAMPLE_SHADING_VALUE clamping"));
	}

	// .min_sample_count
	{
		static const struct Target
		{
			SampleShadingRenderingCase::RenderTarget	target;
			int											numSamples;
			const char*									name;
		} targets[] =
		{
			{ SampleShadingRenderingCase::TARGET_DEFAULT,			0,	"default_framebuffer"					},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			2,	"multisample_texture_samples_2"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			4,	"multisample_texture_samples_4"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			8,	"multisample_texture_samples_8"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			16,	"multisample_texture_samples_16"		},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		2,	"multisample_renderbuffer_samples_2"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		4,	"multisample_renderbuffer_samples_4"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		8,	"multisample_renderbuffer_samples_8"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		16,	"multisample_renderbuffer_samples_16"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(targets); ++ndx)
		{
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_color").c_str(),	"Test multiple samples per pixel with color",	targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_COLOR));
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_discard").c_str(),	"Test multiple samples per pixel with",			targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_DISCARD));
		}
	}
}